

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O3

void __thiscall TPZManVector<Fad<double>,_20>::~TPZManVector(TPZManVector<Fad<double>,_20> *this)

{
  ~TPZManVector(this);
  operator_delete(this,0x2a0);
  return;
}

Assistant:

TPZManVector< T, NumExtAlloc >::~TPZManVector() {
    if (this->fStore == fExtAlloc) {
        this->fStore = nullptr;
    }
    this->fNAlloc = 0;
}